

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O3

Arguments * __thiscall Corrade::Utility::Arguments::addArrayArgument(Arguments *this,string *key)

{
  char **ppcVar1;
  pointer pcVar2;
  Entry *pEVar3;
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  *pAVar4;
  Debug *pDVar5;
  ostream *poVar6;
  string helpKey;
  char local_7a [2];
  Error local_78;
  size_t local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->_prefix)._M_string_length == 0) {
    if (key->_M_string_length == 0) {
      poVar6 = Error::defaultOutput();
      Error::Error(&local_78,poVar6,(Flags)0x0);
      Debug::operator<<(&local_78.super_Debug,
                        "Utility::Arguments::addArrayArgument(): key can\'t be empty");
    }
    else {
      pEVar3 = find(this,key);
      if (pEVar3 == (Entry *)0x0) {
        if (this->_arrayArgument == 0) {
          if (this->_finalOptionalArgument == 0) {
            (this->_flags)._value = (this->_flags)._value & 0x7f;
            this->_arrayArgument = (uint16_t)(this->_entries)._size;
            ppcVar1 = &local_78.super_Debug._sourceLocationFile;
            pcVar2 = (key->_M_dataplus)._M_p;
            local_78.super_Debug._output = (ostream *)ppcVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,pcVar2,pcVar2 + key->_M_string_length);
            local_7a[1] = 1;
            local_7a[0] = '\0';
            local_48._M_string_length = 0;
            local_48.field_2._M_local_buf[0] = '\0';
            local_50 = (this->_arrayValues)._size;
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            pEVar3 = Containers::Implementation::
                     arrayGrowBy<Corrade::Utility::Arguments::Entry,Corrade::Containers::ArrayNewAllocator<Corrade::Utility::Arguments::Entry>>
                               (&this->_entries,1);
            Containers::Implementation::
            construct<Corrade::Utility::Arguments::Entry,Corrade::Utility::Arguments::Type,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long>
                      (pEVar3,(Type *)(local_7a + 1),local_7a,key,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_78,&local_48,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p);
            }
            pAVar4 = Containers::Implementation::
                     arrayGrowBy<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>,Corrade::Containers::ArrayNewAllocator<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>>>
                               (&this->_arrayValues,1);
            pAVar4->_data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            pAVar4->_size = 0;
            pAVar4->_deleter =
                 (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_unsigned_long
                  *)0x0;
            if (local_78.super_Debug._output != (ostream *)ppcVar1) {
              operator_delete(local_78.super_Debug._output);
            }
            return this;
          }
          poVar6 = Error::defaultOutput();
          Error::Error(&local_78,poVar6,(Flags)0x0);
          Debug::operator<<(&local_78.super_Debug,
                            "Utility::Arguments::addArrayArgument(): can\'t add more arguments after the final optional one"
                           );
        }
        else {
          poVar6 = Error::defaultOutput();
          Error::Error(&local_78,poVar6,(Flags)0x0);
          pDVar5 = Debug::operator<<(&local_78.super_Debug,
                                     "Utility::Arguments::addArrayArgument(): there\'s already an array argument"
                                    );
          pEVar3 = Containers::
                   Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
                   ::operator[]<unsigned_short,_0>(&this->_entries,this->_arrayArgument);
          operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (pDVar5,&pEVar3->key);
        }
      }
      else {
        poVar6 = Error::defaultOutput();
        Error::Error(&local_78,poVar6,(Flags)0x0);
        pDVar5 = Debug::operator<<(&local_78.super_Debug,
                                   "Utility::Arguments::addArrayArgument(): the key");
        pDVar5 = Implementation::debugPrintStlString(pDVar5,key);
        Debug::operator<<(pDVar5,"is already used");
      }
    }
  }
  else {
    poVar6 = Error::defaultOutput();
    Error::Error(&local_78,poVar6,(Flags)0x0);
    pDVar5 = Debug::operator<<(&local_78.super_Debug,
                               "Utility::Arguments::addArrayArgument(): argument");
    pDVar5 = Implementation::debugPrintStlString(pDVar5,key);
    Debug::operator<<(pDVar5,"not allowed in prefixed version");
  }
  Error::~Error(&local_78);
  abort();
}

Assistant:

Arguments& Arguments::addArrayArgument(std::string key) {
    CORRADE_ASSERT(_prefix.empty(),
        "Utility::Arguments::addArrayArgument(): argument" << key << "not allowed in prefixed version", *this);
    CORRADE_ASSERT(!key.empty(),
        "Utility::Arguments::addArrayArgument(): key can't be empty", *this);
    CORRADE_ASSERT(!find(key),
        "Utility::Arguments::addArrayArgument(): the key" << key << "is already used", *this);

    /* There can be only one array argument and thre can't be both an array
       argument and a final optional argument, as otherwise we would have no
       way to know what is what */
    CORRADE_ASSERT(!_arrayArgument,
        "Utility::Arguments::addArrayArgument(): there's already an array argument" << _entries[_arrayArgument].key, *this);
    CORRADE_ASSERT(!_finalOptionalArgument,
        "Utility::Arguments::addArrayArgument(): can't add more arguments after the final optional one", *this);

    /* Reset the parsed flag -- it's probably a mistake to add an argument and
       then ask for values without parsing again */
    _flags &= ~InternalFlag::Parsed;

    _arrayArgument = _entries.size();
    std::string helpKey = key;
    arrayAppend(_entries, InPlaceInit, Type::ArrayArgument, '\0', std::move(key), std::move(helpKey), std::string(), _arrayValues.size());
    arrayAppend(_arrayValues, InPlaceInit);
    return *this;
}